

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader.cc
# Opt level: O0

Result __thiscall
wabt::anon_unknown_19::BinaryReader::ReadNameSection(BinaryReader *this,Offset section_size)

{
  uint uVar1;
  bool bVar2;
  Result RVar3;
  Index IVar4;
  Index IVar5;
  undefined1 auStack_130 [8];
  string_view local_name;
  Index local_index;
  Index k;
  Index last_local_index;
  uint local_10c;
  Enum local_108;
  Index num_locals;
  uint local_100;
  Index function_index_1;
  Index j_1;
  Index last_function_index_1;
  uint local_f0;
  Enum local_ec;
  Index num_funcs;
  undefined4 uStack_e4;
  undefined4 uStack_e0;
  undefined4 uStack_dc;
  Enum local_d4;
  Enum local_d0;
  Enum local_cc;
  undefined1 auStack_c8 [8];
  string_view function_name;
  uint local_b0;
  Index function_index;
  Index j;
  Index last_function_index;
  uint local_a0;
  Enum local_9c;
  Index num_names;
  undefined4 uStack_94;
  undefined4 uStack_90;
  undefined4 uStack_8c;
  Enum local_88;
  Enum local_84;
  undefined1 auStack_80 [8];
  string_view name;
  undefined1 local_58 [8];
  ReadEndRestoreGuard guard;
  size_t subsection_end;
  Offset local_38;
  Offset subsection_size;
  uint32_t name_type;
  uint32_t previous_subsection_type;
  Index i;
  Offset section_size_local;
  BinaryReader *this_local;
  
  _i = section_size;
  section_size_local = (Offset)this;
  previous_subsection_type = (*this->delegate_->_vptr_BinaryReaderDelegate[0x8b])();
  bVar2 = Succeeded((Result)previous_subsection_type);
  if (((bVar2 ^ 0xffU) & 1) == 0) {
    name_type = 0;
    subsection_size._4_4_ = 0;
    do {
      if (this->read_end_ <= (this->state_).offset) {
        RVar3.enum_ = (*this->delegate_->_vptr_BinaryReaderDelegate[0x95])();
        bVar2 = Succeeded(RVar3);
        if (((bVar2 ^ 0xffU) & 1) == 0) {
          Result::Result((Result *)((long)&this_local + 4),Ok);
          return (Result)this_local._4_4_;
        }
        PrintError(this,"EndNamesSection callback failed");
        Result::Result((Result *)((long)&this_local + 4),Error);
        return (Result)this_local._4_4_;
      }
      RVar3 = ReadU32Leb128(this,(uint32_t *)&subsection_size,"name type");
      bVar2 = Failed(RVar3);
      if (bVar2) {
        Result::Result((Result *)((long)&this_local + 4),Error);
        return (Result)this_local._4_4_;
      }
      if (name_type != 0) {
        if ((uint)subsection_size == subsection_size._4_4_) {
          PrintError(this,"duplicate sub-section");
          Result::Result((Result *)((long)&this_local + 4),Error);
          return (Result)this_local._4_4_;
        }
        if ((uint)subsection_size < subsection_size._4_4_) {
          PrintError(this,"out-of-order sub-section");
          Result::Result((Result *)((long)&this_local + 4),Error);
          return (Result)this_local._4_4_;
        }
      }
      subsection_size._4_4_ = (uint)subsection_size;
      RVar3 = ReadOffset(this,&local_38,"subsection size");
      bVar2 = Failed(RVar3);
      if (bVar2) {
        Result::Result((Result *)((long)&this_local + 4),Error);
        return (Result)this_local._4_4_;
      }
      guard.previous_value_ = (this->state_).offset + local_38;
      if (this->read_end_ < guard.previous_value_) {
        PrintError(this,"invalid sub-section size: extends past end");
        Result::Result((Result *)((long)&this_local + 4),Error);
        return (Result)this_local._4_4_;
      }
      ValueRestoreGuard<unsigned_long,_&wabt::(anonymous_namespace)::BinaryReader::read_end_>::
      ValueRestoreGuard((ValueRestoreGuard<unsigned_long,_&wabt::(anonymous_namespace)::BinaryReader::read_end_>
                         *)local_58,this);
      this->read_end_ = guard.previous_value_;
      if ((uint)subsection_size == 0) {
        RVar3.enum_ = (*this->delegate_->_vptr_BinaryReaderDelegate[0x8c])
                                (this->delegate_,(ulong)name_type,0,local_38);
        bVar2 = Succeeded(RVar3);
        if (((bVar2 ^ 0xffU) & 1) == 0) {
          if (local_38 == 0) goto LAB_01648ca3;
          string_view::string_view((string_view *)auStack_80);
          local_84 = (Enum)ReadStr(this,(string_view *)auStack_80,"module name");
          bVar2 = Failed((Result)local_84);
          if (bVar2) {
            Result::Result((Result *)((long)&this_local + 4),Error);
            name.size_._0_4_ = 1;
          }
          else {
            num_names = auStack_80._0_4_;
            uStack_94 = auStack_80._4_4_;
            uStack_90 = name.data_._0_4_;
            uStack_8c = name.data_._4_4_;
            local_88 = (*this->delegate_->_vptr_BinaryReaderDelegate[0x8d])
                                 (this->delegate_,CONCAT44(auStack_80._4_4_,auStack_80._0_4_),
                                  CONCAT44(name.data_._4_4_,name.data_._0_4_));
            bVar2 = Succeeded((Result)local_88);
            if (((bVar2 ^ 0xffU) & 1) == 0) goto LAB_01648ca3;
            PrintError(this,"OnModuleName callback failed");
            Result::Result((Result *)((long)&this_local + 4),Error);
            name.size_._0_4_ = 1;
          }
        }
        else {
          PrintError(this,"OnModuleNameSubsection callback failed");
          Result::Result((Result *)((long)&this_local + 4),Error);
          name.size_._0_4_ = 1;
        }
      }
      else if ((uint)subsection_size == 1) {
        local_9c = (*this->delegate_->_vptr_BinaryReaderDelegate[0x8e])
                             (this->delegate_,(ulong)name_type,1,local_38);
        bVar2 = Succeeded((Result)local_9c);
        if (((bVar2 ^ 0xffU) & 1) == 0) {
          if (local_38 == 0) goto LAB_01648ca3;
          RVar3 = ReadCount(this,&local_a0,"name count");
          bVar2 = Failed(RVar3);
          if (bVar2) {
            Result::Result((Result *)((long)&this_local + 4),Error);
            name.size_._0_4_ = 1;
          }
          else {
            RVar3.enum_ = (*this->delegate_->_vptr_BinaryReaderDelegate[0x8f])();
            bVar2 = Succeeded(RVar3);
            if (((bVar2 ^ 0xffU) & 1) == 0) {
              function_index = 0xffffffff;
              for (local_b0 = 0; local_b0 < local_a0; local_b0 = local_b0 + 1) {
                string_view::string_view((string_view *)auStack_c8);
                local_cc = (Enum)ReadIndex(this,(Index *)((long)&function_name.size_ + 4),
                                           "function index");
                bVar2 = Failed((Result)local_cc);
                uVar1 = function_name.size_._4_4_;
                if (bVar2) {
                  Result::Result((Result *)((long)&this_local + 4),Error);
                  name.size_._0_4_ = 1;
                  goto LAB_01648cfc;
                }
                if (function_name.size_._4_4_ == function_index) {
                  PrintError(this,"duplicate function name: %u",(ulong)function_name.size_._4_4_);
                  Result::Result((Result *)((long)&this_local + 4),Error);
                  name.size_._0_4_ = 1;
                  goto LAB_01648cfc;
                }
                if ((function_index != 0xffffffff) && (function_name.size_._4_4_ <= function_index))
                {
                  PrintError(this,"function index out of order: %u",(ulong)function_name.size_._4_4_
                            );
                  Result::Result((Result *)((long)&this_local + 4),Error);
                  name.size_._0_4_ = 1;
                  goto LAB_01648cfc;
                }
                function_index = function_name.size_._4_4_;
                IVar4 = NumTotalFuncs(this);
                if (IVar4 <= uVar1) {
                  PrintError(this,"invalid function index: %u",(ulong)function_name.size_._4_4_);
                  Result::Result((Result *)((long)&this_local + 4),Error);
                  name.size_._0_4_ = 1;
                  goto LAB_01648cfc;
                }
                local_d0 = (Enum)ReadStr(this,(string_view *)auStack_c8,"function name");
                bVar2 = Failed((Result)local_d0);
                if (bVar2) {
                  Result::Result((Result *)((long)&this_local + 4),Error);
                  name.size_._0_4_ = 1;
                  goto LAB_01648cfc;
                }
                num_funcs = auStack_c8._0_4_;
                uStack_e4 = auStack_c8._4_4_;
                uStack_e0 = function_name.data_._0_4_;
                uStack_dc = function_name.data_._4_4_;
                local_d4 = (*this->delegate_->_vptr_BinaryReaderDelegate[0x90])
                                     (this->delegate_,(ulong)function_name.size_._4_4_,
                                      CONCAT44(auStack_c8._4_4_,auStack_c8._0_4_),
                                      CONCAT44(function_name.data_._4_4_,function_name.data_._0_4_))
                ;
                bVar2 = Succeeded((Result)local_d4);
                if (((bVar2 ^ 0xffU) & 1) != 0) {
                  PrintError(this,"OnFunctionName callback failed");
                  Result::Result((Result *)((long)&this_local + 4),Error);
                  name.size_._0_4_ = 1;
                  goto LAB_01648cfc;
                }
              }
              goto LAB_01648ca3;
            }
            PrintError(this,"OnFunctionNamesCount callback failed");
            Result::Result((Result *)((long)&this_local + 4),Error);
            name.size_._0_4_ = 1;
          }
        }
        else {
          PrintError(this,"OnFunctionNameSubsection callback failed");
          Result::Result((Result *)((long)&this_local + 4),Error);
          name.size_._0_4_ = 1;
        }
      }
      else if ((uint)subsection_size == 2) {
        local_ec = (*this->delegate_->_vptr_BinaryReaderDelegate[0x91])
                             (this->delegate_,(ulong)name_type,2,local_38);
        bVar2 = Succeeded((Result)local_ec);
        if (((bVar2 ^ 0xffU) & 1) == 0) {
          if (local_38 == 0) goto LAB_01648ca3;
          last_function_index_1 = (Index)ReadCount(this,&local_f0,"function count");
          bVar2 = Failed((Result)last_function_index_1);
          if (bVar2) {
            Result::Result((Result *)((long)&this_local + 4),Error);
            name.size_._0_4_ = 1;
          }
          else {
            j_1 = (*this->delegate_->_vptr_BinaryReaderDelegate[0x92])();
            bVar2 = Succeeded((Result)j_1);
            if (((bVar2 ^ 0xffU) & 1) == 0) {
              function_index_1 = 0xffffffff;
              for (local_100 = 0; local_100 < local_f0; local_100 = local_100 + 1) {
                local_108 = (Enum)ReadIndex(this,&num_locals,"function index");
                bVar2 = Failed((Result)local_108);
                IVar4 = num_locals;
                if (bVar2) {
                  Result::Result((Result *)((long)&this_local + 4),Error);
                  name.size_._0_4_ = 1;
                  goto LAB_01648cfc;
                }
                IVar5 = NumTotalFuncs(this);
                if (IVar5 <= IVar4) {
                  PrintError(this,"invalid function index: %u",(ulong)num_locals);
                  Result::Result((Result *)((long)&this_local + 4),Error);
                  name.size_._0_4_ = 1;
                  goto LAB_01648cfc;
                }
                if ((function_index_1 != 0xffffffff) && (num_locals <= function_index_1)) {
                  PrintError(this,"locals function index out of order: %u",(ulong)num_locals);
                  Result::Result((Result *)((long)&this_local + 4),Error);
                  name.size_._0_4_ = 1;
                  goto LAB_01648cfc;
                }
                function_index_1 = num_locals;
                RVar3 = ReadCount(this,&local_10c,"local count");
                bVar2 = Failed(RVar3);
                if (bVar2) {
                  Result::Result((Result *)((long)&this_local + 4),Error);
                  name.size_._0_4_ = 1;
                  goto LAB_01648cfc;
                }
                RVar3.enum_ = (*this->delegate_->_vptr_BinaryReaderDelegate[0x93])
                                        (this->delegate_,(ulong)num_locals,(ulong)local_10c);
                bVar2 = Succeeded(RVar3);
                if (((bVar2 ^ 0xffU) & 1) != 0) {
                  PrintError(this,"OnLocalNameLocalCount callback failed");
                  Result::Result((Result *)((long)&this_local + 4),Error);
                  name.size_._0_4_ = 1;
                  goto LAB_01648cfc;
                }
                local_index = 0xffffffff;
                for (local_name.size_._4_4_ = 0; local_name.size_._4_4_ < local_10c;
                    local_name.size_._4_4_ = local_name.size_._4_4_ + 1) {
                  string_view::string_view((string_view *)auStack_130);
                  RVar3 = ReadIndex(this,(Index *)&local_name.size_,"named index");
                  bVar2 = Failed(RVar3);
                  if (bVar2) {
                    Result::Result((Result *)((long)&this_local + 4),Error);
                    name.size_._0_4_ = 1;
                    goto LAB_01648cfc;
                  }
                  if ((uint)local_name.size_ == local_index) {
                    PrintError(this,"duplicate local index: %u",(ulong)(uint)local_name.size_);
                    Result::Result((Result *)((long)&this_local + 4),Error);
                    name.size_._0_4_ = 1;
                    goto LAB_01648cfc;
                  }
                  if ((local_index != 0xffffffff) && ((uint)local_name.size_ <= local_index)) {
                    PrintError(this,"local index out of order: %u",(ulong)(uint)local_name.size_);
                    Result::Result((Result *)((long)&this_local + 4),Error);
                    name.size_._0_4_ = 1;
                    goto LAB_01648cfc;
                  }
                  local_index = (uint)local_name.size_;
                  RVar3 = ReadStr(this,(string_view *)auStack_130,"name");
                  bVar2 = Failed(RVar3);
                  if (bVar2) {
                    Result::Result((Result *)((long)&this_local + 4),Error);
                    name.size_._0_4_ = 1;
                    goto LAB_01648cfc;
                  }
                  RVar3.enum_ = (*this->delegate_->_vptr_BinaryReaderDelegate[0x94])
                                          (this->delegate_,(ulong)num_locals,
                                           (ulong)(uint)local_name.size_,
                                           CONCAT44(auStack_130._4_4_,auStack_130._0_4_),
                                           CONCAT44(local_name.data_._4_4_,local_name.data_._0_4_));
                  bVar2 = Succeeded(RVar3);
                  if (((bVar2 ^ 0xffU) & 1) != 0) {
                    PrintError(this,"OnLocalName callback failed");
                    Result::Result((Result *)((long)&this_local + 4),Error);
                    name.size_._0_4_ = 1;
                    goto LAB_01648cfc;
                  }
                }
              }
              goto LAB_01648ca3;
            }
            PrintError(this,"OnLocalNameFunctionCount callback failed");
            Result::Result((Result *)((long)&this_local + 4),Error);
            name.size_._0_4_ = 1;
          }
        }
        else {
          PrintError(this,"OnLocalNameSubsection callback failed");
          Result::Result((Result *)((long)&this_local + 4),Error);
          name.size_._0_4_ = 1;
        }
      }
      else {
        (this->state_).offset = guard.previous_value_;
LAB_01648ca3:
        name_type = name_type + 1;
        if ((this->state_).offset == guard.previous_value_) {
          name.size_._0_4_ = 0;
        }
        else {
          PrintError(this,"unfinished sub-section (expected end: 0x%zx)",guard.previous_value_);
          Result::Result((Result *)((long)&this_local + 4),Error);
          name.size_._0_4_ = 1;
        }
      }
LAB_01648cfc:
      ValueRestoreGuard<unsigned_long,_&wabt::(anonymous_namespace)::BinaryReader::read_end_>::
      ~ValueRestoreGuard((ValueRestoreGuard<unsigned_long,_&wabt::(anonymous_namespace)::BinaryReader::read_end_>
                          *)local_58);
    } while ((int)name.size_ == 0);
  }
  else {
    PrintError(this,"BeginNamesSection callback failed");
    Result::Result((Result *)((long)&this_local + 4),Error);
  }
  return (Result)this_local._4_4_;
}

Assistant:

Result BinaryReader::ReadNameSection(Offset section_size) {
  CALLBACK(BeginNamesSection, section_size);
  Index i = 0;
  uint32_t previous_subsection_type = 0;
  while (state_.offset < read_end_) {
    uint32_t name_type;
    Offset subsection_size;
    CHECK_RESULT(ReadU32Leb128(&name_type, "name type"));
    if (i != 0) {
      ERROR_UNLESS(name_type != previous_subsection_type,
                   "duplicate sub-section");
      ERROR_UNLESS(name_type >= previous_subsection_type,
                   "out-of-order sub-section");
    }
    previous_subsection_type = name_type;
    CHECK_RESULT(ReadOffset(&subsection_size, "subsection size"));
    size_t subsection_end = state_.offset + subsection_size;
    ERROR_UNLESS(subsection_end <= read_end_,
                 "invalid sub-section size: extends past end");
    ReadEndRestoreGuard guard(this);
    read_end_ = subsection_end;

    switch (static_cast<NameSectionSubsection>(name_type)) {
      case NameSectionSubsection::Module:
        CALLBACK(OnModuleNameSubsection, i, name_type, subsection_size);
        if (subsection_size) {
          string_view name;
          CHECK_RESULT(ReadStr(&name, "module name"));
          CALLBACK(OnModuleName, name);
        }
        break;
      case NameSectionSubsection::Function:
        CALLBACK(OnFunctionNameSubsection, i, name_type, subsection_size);
        if (subsection_size) {
          Index num_names;
          CHECK_RESULT(ReadCount(&num_names, "name count"));
          CALLBACK(OnFunctionNamesCount, num_names);
          Index last_function_index = kInvalidIndex;

          for (Index j = 0; j < num_names; ++j) {
            Index function_index;
            string_view function_name;

            CHECK_RESULT(ReadIndex(&function_index, "function index"));
            ERROR_UNLESS(function_index != last_function_index,
                         "duplicate function name: %u", function_index);
            ERROR_UNLESS(last_function_index == kInvalidIndex ||
                             function_index > last_function_index,
                         "function index out of order: %u", function_index);
            last_function_index = function_index;
            ERROR_UNLESS(function_index < NumTotalFuncs(),
                         "invalid function index: %" PRIindex, function_index);
            CHECK_RESULT(ReadStr(&function_name, "function name"));
            CALLBACK(OnFunctionName, function_index, function_name);
          }
        }
        break;
      case NameSectionSubsection::Local:
        CALLBACK(OnLocalNameSubsection, i, name_type, subsection_size);
        if (subsection_size) {
          Index num_funcs;
          CHECK_RESULT(ReadCount(&num_funcs, "function count"));
          CALLBACK(OnLocalNameFunctionCount, num_funcs);
          Index last_function_index = kInvalidIndex;
          for (Index j = 0; j < num_funcs; ++j) {
            Index function_index;
            CHECK_RESULT(ReadIndex(&function_index, "function index"));
            ERROR_UNLESS(function_index < NumTotalFuncs(),
                         "invalid function index: %u", function_index);
            ERROR_UNLESS(last_function_index == kInvalidIndex ||
                             function_index > last_function_index,
                         "locals function index out of order: %u",
                         function_index);
            last_function_index = function_index;
            Index num_locals;
            CHECK_RESULT(ReadCount(&num_locals, "local count"));
            CALLBACK(OnLocalNameLocalCount, function_index, num_locals);
            Index last_local_index = kInvalidIndex;
            for (Index k = 0; k < num_locals; ++k) {
              Index local_index;
              string_view local_name;

              CHECK_RESULT(ReadIndex(&local_index, "named index"));
              ERROR_UNLESS(local_index != last_local_index,
                           "duplicate local index: %u", local_index);
              ERROR_UNLESS(last_local_index == kInvalidIndex ||
                               local_index > last_local_index,
                           "local index out of order: %u", local_index);
              last_local_index = local_index;
              CHECK_RESULT(ReadStr(&local_name, "name"));
              CALLBACK(OnLocalName, function_index, local_index, local_name);
            }
          }
        }
        break;
      default:
        // Unknown subsection, skip it.
        state_.offset = subsection_end;
        break;
    }
    ++i;
    ERROR_UNLESS(state_.offset == subsection_end,
                 "unfinished sub-section (expected end: 0x%" PRIzx ")",
                 subsection_end);
  }
  CALLBACK0(EndNamesSection);
  return Result::Ok;
}